

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

void __thiscall
QProxyStyle::drawItemText
          (QProxyStyle *this,QPainter *painter,QRect *rect,int flags,QPalette *pal,bool enabled,
          QString *text,ColorRole textRole)

{
  QProxyStylePrivate *pQVar1;
  QStyle *pQVar2;
  undefined4 in_ECX;
  QProxyStylePrivate *in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  byte in_R9B;
  undefined8 in_stack_00000008;
  QProxyStylePrivate *d;
  
  pQVar1 = d_func((QProxyStyle *)0x408fed);
  QProxyStylePrivate::ensureBaseStyle(in_RDX);
  pQVar2 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x40900d);
  (**(code **)(*(long *)pQVar2 + 0x98))
            (pQVar2,in_RSI,in_RDX,in_ECX,in_R8,in_R9B & 1,in_stack_00000008,d._0_4_,pQVar1);
  return;
}

Assistant:

void QProxyStyle::drawItemText(QPainter *painter, const QRect &rect, int flags, const QPalette &pal, bool enabled,
                               const QString &text, QPalette::ColorRole textRole) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawItemText(painter, rect, flags, pal, enabled, text, textRole);
}